

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall S2Polygon::InitFromBuilder(S2Polygon *this,S2Polygon *a,S2Builder *builder)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  double dVar4;
  S2LogMessage local_80;
  undefined1 local_70 [8];
  S2Error error;
  S2Polygon *local_38;
  unique_ptr<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>_>
  local_30;
  unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> local_28;
  S2Builder *local_20;
  S2Builder *builder_local;
  S2Polygon *a_local;
  S2Polygon *this_local;
  
  local_38 = this;
  local_20 = builder;
  builder_local = (S2Builder *)a;
  a_local = this;
  absl::make_unique<s2builderutil::S2PolygonLayer,S2Polygon*>((absl *)&local_30,&local_38);
  std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>::
  unique_ptr<s2builderutil::S2PolygonLayer,std::default_delete<s2builderutil::S2PolygonLayer>,void>
            ((unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>> *)&local_28,
             &local_30);
  S2Builder::StartLayer(builder,&local_28);
  std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::~unique_ptr(&local_28);
  std::
  unique_ptr<s2builderutil::S2PolygonLayer,_std::default_delete<s2builderutil::S2PolygonLayer>_>::
  ~unique_ptr(&local_30);
  S2Builder::AddPolygon(local_20,(S2Polygon *)builder_local);
  S2Error::S2Error((S2Error *)local_70);
  bVar1 = S2Builder::Build(local_20,(S2Error *)local_70);
  if (bVar1) {
    iVar2 = num_loops(this);
    if (((iVar2 == 0) &&
        (dVar4 = S2LatLngRect::Area((S2LatLngRect *)&builder_local->min_edge_length_to_split_ca_),
        6.283185307179586 < dVar4)) &&
       (dVar4 = GetArea((S2Polygon *)builder_local), 6.283185307179586 < dVar4)) {
      Invert(this);
    }
    S2Error::~S2Error((S2Error *)local_70);
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x3da,kFatal,(ostream *)&std::cerr);
  poVar3 = S2LogMessage::stream(&local_80);
  poVar3 = std::operator<<(poVar3,"Could not build polygon: ");
  ::operator<<(poVar3,(S2Error *)local_70);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_80);
}

Assistant:

void S2Polygon::InitFromBuilder(const S2Polygon& a, S2Builder* builder) {
  builder->StartLayer(make_unique<S2PolygonLayer>(this));
  builder->AddPolygon(a);
  S2Error error;
  if (!builder->Build(&error)) {
    S2_LOG(DFATAL) << "Could not build polygon: " << error;
  }
  // If there are no loops, check whether the result should be the full
  // polygon rather than the empty one.  (See InitToApproxIntersection.)
  if (num_loops() == 0) {
    if (a.bound_.Area() > 2 * M_PI && a.GetArea() > 2 * M_PI) Invert();
  }
}